

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O0

asn_enc_rval_t *
NativeEnumerated_encode_xer
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  asn_INTEGER_enum_map_t *paVar5;
  undefined8 uStackY_a0;
  char acStackY_98 [8];
  long in_stack_ffffffffffffff70;
  asn_INTEGER_specifics_t *in_stack_ffffffffffffff78;
  char *pcVar6;
  char *local_80;
  asn_enc_rval_t *tmp_error;
  char *src;
  size_t srcsize;
  asn_INTEGER_enum_map_t *el;
  long *native;
  asn_enc_rval_t er;
  asn_INTEGER_specifics_t *specs;
  asn_app_consume_bytes_f *cb_local;
  xer_encoder_flags_e flags_local;
  int ilevel_local;
  void *sptr_local;
  asn_TYPE_descriptor_t *td_local;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    if (td == (asn_TYPE_descriptor_t *)0x0) {
      local_80 = "";
    }
    else {
      local_80 = td->name;
    }
    uStackY_a0 = 0x152118;
    ASN_DEBUG("Failed to encode element %s",local_80);
  }
  else {
    uStackY_a0 = 0x15212d;
    paVar5 = INTEGER_map_value2enum(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (paVar5 == (asn_INTEGER_enum_map_t *)0x0) {
      uStackY_a0 = 0x152232;
      ASN_DEBUG("ASN.1 forbids dealing with unknown value of ENUMERATED type");
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      if (td == (asn_TYPE_descriptor_t *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = td->name;
      }
      uStackY_a0 = 0x152289;
      ASN_DEBUG("Failed to encode element %s",pcVar6);
    }
    else {
      sVar1 = paVar5->enum_len;
      lVar2 = -(sVar1 + 0x14 & 0xfffffffffffffff0);
      pcVar6 = paVar5->enum_name;
      *(undefined8 *)((long)&uStackY_a0 + lVar2) = 0x152183;
      iVar3 = snprintf(acStackY_98 + lVar2,sVar1 + 5,"<%s/>",pcVar6);
      *(undefined8 *)((long)&uStackY_a0 + lVar2) = 0x15219b;
      iVar4 = (*cb)(acStackY_98 + lVar2,(long)iVar3,app_key);
      if (iVar4 < 0) {
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        __return_storage_ptr__->structure_ptr = sptr;
        if (td == (asn_TYPE_descriptor_t *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = td->name;
        }
        *(undefined8 *)((long)&uStackY_a0 + lVar2) = 0x1521f0;
        ASN_DEBUG("Failed to encode element %s",pcVar6);
      }
      else {
        __return_storage_ptr__->encoded = (long)iVar3;
        __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
        __return_storage_ptr__->structure_ptr = (void *)0x0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NativeEnumerated_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
        int ilevel, enum xer_encoder_flags_e flags,
                asn_app_consume_bytes_f *cb, void *app_key) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
        asn_enc_rval_t er;
        const long *native = (const long *)sptr;
	const asn_INTEGER_enum_map_t *el;

        (void)ilevel;
        (void)flags;

        if(!native) ASN__ENCODE_FAILED;

	el = INTEGER_map_value2enum(specs, *native);
	if(el) {
		size_t srcsize = el->enum_len + 5;
		char *src = (char *)alloca(srcsize);

		er.encoded = snprintf(src, srcsize, "<%s/>", el->enum_name);
		assert(er.encoded > 0 && (size_t)er.encoded < srcsize);
		if(cb(src, er.encoded, app_key) < 0) ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	} else {
		ASN_DEBUG("ASN.1 forbids dealing with "
			"unknown value of ENUMERATED type");
		ASN__ENCODE_FAILED;
	}
}